

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::scoutpoint(tetgenmesh *this,point searchpt,triface *searchtet,int randflag)

{
  uint uVar1;
  tetrahedron ppdVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  memorypool *pmVar5;
  void **ppvVar6;
  tetrahedron ppdVar7;
  bool bVar8;
  locateresult lVar9;
  int iVar10;
  tetrahedron *pppdVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  tetgenmesh *ptVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double dVar17;
  double local_88;
  double local_68;
  double local_58;
  double local_48;
  
  if (randflag == 0) {
    if (searchtet->tet == (tetrahedron *)0x0) {
      searchtet->tet = (this->recenttet).tet;
      searchtet->ver = (this->recenttet).ver;
    }
  }
  else {
    randomsample(this,searchpt,searchtet);
  }
  bVar8 = false;
  ptVar15 = this;
  lVar9 = locate(this,searchpt,searchtet,0);
  local_68 = extraout_XMM0_Qa;
  if (lVar9 == OUTSIDE) {
    if (this->b->convex != 0) {
      return 1;
    }
    pppdVar11 = searchtet->tet;
    iVar10 = searchtet->ver;
    ppdVar2 = pppdVar11[orgpivot[iVar10]];
    ppdVar3 = pppdVar11[destpivot[iVar10]];
    ppdVar4 = pppdVar11[apexpivot[iVar10]];
    dVar16 = triarea(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4);
    local_68 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,searchpt);
    bVar8 = true;
    if (ABS(local_68 / dVar16) < this->b->epsilon) {
      uVar1 = searchtet->ver;
      ppdVar2 = searchtet->tet[uVar1 & 3];
      uVar13 = (uint)ppdVar2 & 0xf;
      searchtet->ver = uVar13;
      searchtet->tet = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
      searchtet->ver = fsymtbl[(int)uVar1][uVar13];
      bVar8 = false;
    }
  }
  if (bVar8) {
    pmVar5 = this->tetrahedrons;
    ppvVar6 = pmVar5->firstblock;
    pmVar5->pathblock = ppvVar6;
    pmVar5->pathitem =
         (void *)((long)ppvVar6 +
                 (((long)pmVar5->alignbytes + 8U) -
                 (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
    pmVar5->pathitemsleft = pmVar5->itemsperblock;
    ptVar15 = this;
    pppdVar11 = tetrahedrontraverse(this);
    searchtet->tet = pppdVar11;
    if (pppdVar11 == (tetrahedron *)0x0) {
      local_88 = 0.0;
      local_48 = 0.0;
      local_58 = 0.0;
    }
    else {
      local_58 = 0.0;
      local_48 = 0.0;
      local_88 = 0.0;
      do {
        iVar10 = searchtet->ver;
        ppdVar2 = pppdVar11[orgpivot[iVar10]];
        ppdVar3 = pppdVar11[destpivot[iVar10]];
        ppdVar4 = pppdVar11[apexpivot[iVar10]];
        ppdVar7 = pppdVar11[oppopivot[iVar10]];
        dVar16 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                              (double *)ppdVar7);
        if (dVar16 < 0.0) {
          local_68 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                                  searchpt);
          dVar17 = this->b->epsilon;
          local_68 = (double)(~-(ulong)(ABS(local_68 / dVar16) < dVar17) & (ulong)local_68);
          if (local_68 <= 0.0) {
            local_88 = orient3dfast(ptVar15,(double *)ppdVar3,(double *)ppdVar2,(double *)ppdVar7,
                                    searchpt);
            local_88 = (double)(~-(ulong)(ABS(local_88 / dVar16) < dVar17) & (ulong)local_88);
            if (local_88 <= 0.0) {
              local_48 = orient3dfast(ptVar15,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar7,
                                      searchpt);
              local_48 = (double)(~-(ulong)(ABS(local_48 / dVar16) < dVar17) & (ulong)local_48);
              if (local_48 <= 0.0) {
                local_58 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar4,
                                        (double *)ppdVar7,searchpt);
                local_58 = (double)(~-(ulong)(ABS(local_58 / dVar16) < dVar17) & (ulong)local_58);
                if (local_58 <= 0.0) break;
              }
            }
          }
        }
        ptVar15 = this;
        pppdVar11 = tetrahedrontraverse(this);
        searchtet->tet = pppdVar11;
      } while (pppdVar11 != (tetrahedron *)0x0);
    }
    this->nonregularcount = this->nonregularcount + 1;
  }
  else {
    pppdVar11 = searchtet->tet;
    iVar10 = searchtet->ver;
    ppdVar2 = pppdVar11[orgpivot[iVar10]];
    ppdVar3 = pppdVar11[destpivot[iVar10]];
    ppdVar4 = pppdVar11[apexpivot[iVar10]];
    ppdVar7 = pppdVar11[oppopivot[iVar10]];
    dVar17 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                          (double *)ppdVar7);
    local_68 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,searchpt);
    local_88 = orient3dfast(ptVar15,(double *)ppdVar3,(double *)ppdVar2,(double *)ppdVar7,searchpt);
    local_48 = orient3dfast(ptVar15,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar7,searchpt);
    local_58 = orient3dfast(ptVar15,(double *)ppdVar2,(double *)ppdVar4,(double *)ppdVar7,searchpt);
    dVar16 = this->b->epsilon;
    local_68 = (double)(~-(ulong)(ABS(local_68 / dVar17) < dVar16) & (ulong)local_68);
    local_88 = (double)(~-(ulong)(ABS(local_88 / dVar17) < dVar16) & (ulong)local_88);
    local_48 = (double)(~-(ulong)(ABS(local_48 / dVar17) < dVar16) & (ulong)local_48);
    if (ABS(local_58 / dVar17) < dVar16) {
      local_58 = 0.0;
    }
  }
  if (searchtet->tet == (tetrahedron *)0x0) {
    return 1;
  }
  if ((local_68 != 0.0) || (NAN(local_68))) {
    if ((local_88 != 0.0) || (NAN(local_88))) {
      if ((local_48 != 0.0) || (NAN(local_48))) {
        if ((local_58 == 0.0) && (!NAN(local_58))) {
          iVar10 = eprevtbl[searchtet->ver];
          searchtet->ver = iVar10;
          searchtet->ver = esymtbl[iVar10];
          return 3;
        }
        return 2;
      }
      iVar10 = enexttbl[searchtet->ver];
      searchtet->ver = iVar10;
      iVar10 = esymtbl[iVar10];
      searchtet->ver = iVar10;
      if (local_58 != 0.0) {
        return 3;
      }
      if (NAN(local_58)) {
        return 3;
      }
LAB_00122402:
      lVar12 = (long)iVar10;
      piVar14 = eprevtbl;
    }
    else {
      lVar12 = (long)esymtbl[searchtet->ver];
      searchtet->ver = esymtbl[searchtet->ver];
      if ((local_48 == 0.0) && (!NAN(local_48))) {
        searchtet->ver = eprevtbl[lVar12];
        goto LAB_00122372;
      }
      if (local_58 != 0.0) {
        return 3;
      }
      if (NAN(local_58)) {
        return 3;
      }
LAB_001223ed:
      piVar14 = enexttbl;
    }
    searchtet->ver = piVar14[lVar12];
    iVar10 = 4;
  }
  else {
    if ((local_88 != 0.0) || (NAN(local_88))) {
      if ((local_48 != 0.0) || (NAN(local_48))) {
        if (local_58 != 0.0) {
          return 3;
        }
        if (NAN(local_58)) {
          return 3;
        }
        iVar10 = searchtet->ver;
        goto LAB_00122402;
      }
      lVar12 = (long)searchtet->ver;
      if ((local_58 != 0.0) || (NAN(local_58))) goto LAB_001223ed;
      piVar14 = eprevtbl;
    }
    else {
      if ((local_48 != 0.0) || (NAN(local_48))) {
LAB_00122372:
        return (local_58 == 0.0) + 4;
      }
      lVar12 = (long)searchtet->ver;
      piVar14 = enexttbl;
    }
    searchtet->ver = piVar14[lVar12];
    iVar10 = 5;
  }
  return iVar10;
}

Assistant:

int tetgenmesh::scoutpoint(point searchpt, triface *searchtet, int randflag)
{
  point pa, pb, pc, pd;
  enum locateresult loc = OUTSIDE;
  REAL vol, ori1, ori2 = 0, ori3 = 0, ori4 = 0;
  int t1ver;


  // Randomly select a good starting tet.
  if (randflag) {
    randomsample(searchpt, searchtet);
  } else {
    if (searchtet->tet == NULL) {
      *searchtet = recenttet;
    }
  }
  loc = locate(searchpt, searchtet);

  if (loc == OUTSIDE) {
    if (b->convex) { // -c option
      // The point lies outside of the convex hull.
      return (int) loc;
    }
    // Test if it lies nearly on the hull face.
    // Reuse vol, ori1.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    vol = triarea(pa, pb, pc);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) {
      loc = ONFACE; // On face (or on edge, or on vertex).
      fsymself(*searchtet);
    }
  }

  if (loc != OUTSIDE) {
    // Round the result of location.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    pd = oppo(*searchtet);
    vol = orient3dfast(pa, pb, pc, pd);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    ori2 = orient3dfast(pb, pa, pd, searchpt);
    ori3 = orient3dfast(pc, pb, pd, searchpt);
    ori4 = orient3dfast(pa, pc, pd, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) ori1 = 0;
    if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
    if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
    if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
  } else { // if (loc == OUTSIDE) {
    // Do a brute force search for the point (with rounding).
    tetrahedrons->traversalinit();
    searchtet->tet = tetrahedrontraverse();
    while (searchtet->tet != NULL) {
      pa = org(*searchtet);
      pb = dest(*searchtet);
      pc = apex(*searchtet);
      pd = oppo(*searchtet);

      vol = orient3dfast(pa, pb, pc, pd); 
      if (vol < 0) {
        ori1 = orient3dfast(pa, pb, pc, searchpt);
        if (fabs(ori1 / vol) < b->epsilon) ori1 = 0; // Rounding.
        if (ori1 <= 0) {
          ori2 = orient3dfast(pb, pa, pd, searchpt);
          if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
          if (ori2 <= 0) {
            ori3 = orient3dfast(pc, pb, pd, searchpt);
            if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
            if (ori3 <= 0) {
              ori4 = orient3dfast(pa, pc, pd, searchpt);
              if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
              if (ori4 <= 0) {
                // Found the tet. Return its location. 
                break;
              } // ori4
            } // ori3
          } // ori2
        } // ori1
      }

      searchtet->tet = tetrahedrontraverse();
    } // while (searchtet->tet != NULL)
    nonregularcount++;  // Re-use this counter.
  }

  if (searchtet->tet != NULL) {
    // Return the point location.
    if (ori1 == 0) { // on face [a,b,c]
      if (ori2 == 0) { // on edge [a,b].
        if (ori3 == 0) { // on vertex [b].
          enextself(*searchtet); // [b,c,a,d]
          loc = ONVERTEX;
        } else {
          if (ori4 == 0) { // on vertex [a]
            loc =  ONVERTEX; // [a,b,c,d]
          } else {    
            loc =  ONEDGE; // [a,b,c,d]
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on edge [b,c]
          if (ori4 == 0) { // on vertex [c]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONVERTEX;
          } else {
            enextself(*searchtet); // [b,c,a,d]
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [c,a]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      }
    } else { // ori1 != 0
      if (ori2 == 0) { // on face [b,a,d]
        esymself(*searchtet); // [b,a,d,c]
        if (ori3 == 0) { // on edge [b,d]
          eprevself(*searchtet); // [d,b,a,c]
          if (ori4 == 0) { // on vertex [d]                      
            loc =  ONVERTEX;
          } else {
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [a,d]
            enextself(*searchtet); // [a,d,b,c]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on face [c,b,d]
          enextself(*searchtet);
          esymself(*searchtet);
          if (ori4 == 0) { // on edge [c,d]
            eprevself(*searchtet);
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        } else {
          if (ori4 == 0) { // on face [a,c,d]
            eprevself(*searchtet);
            esymself(*searchtet);
            loc =  ONFACE;
          } else { // inside tet [a,b,c,d]
            loc =  INTETRAHEDRON;
          } // ori4
        } // ori3
      } // ori2
    } // ori1
  } else {
    loc = OUTSIDE;
  }

  return (int) loc;
}